

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_count_quantity.cpp
# Opt level: O2

string * __thiscall
polyscope::SurfaceCountQuantity::getColorMap_abi_cxx11_
          (string *__return_storage_ptr__,SurfaceCountQuantity *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&(this->colorMap).value);
  return __return_storage_ptr__;
}

Assistant:

std::string SurfaceCountQuantity::getColorMap() { return colorMap.get(); }